

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::
find<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::_::HashSetCallbacks> *this,
          ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table,ArrayPtr<const_unsigned_char> *params)

{
  uchar *puVar1;
  ulong uVar2;
  uchar *__s2;
  size_t __n;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  long lVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  ArrayPtr<const_unsigned_char> *pAVar8;
  ArrayPtr<const_unsigned_char> *in_R8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  Maybe<unsigned_long> MVar12;
  Maybe<unsigned_long> MVar13;
  
  MVar12.ptr.field_1.value = table.size_;
  pAVar8 = table.ptr;
  if (pAVar8[1].size_ == 0) {
    *(undefined1 *)this = 0;
    MVar12.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar12.ptr;
  }
  uVar3 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,*in_R8);
  puVar1 = pAVar8[1].ptr;
  uVar2 = pAVar8[1].size_;
  uVar11 = (ulong)((int)uVar2 - 1U & uVar3);
  uVar9 = *(uint *)(puVar1 + uVar11 * 8 + 4);
  aVar7 = extraout_RDX;
  if (uVar9 != 0) {
    puVar5 = (uint *)(puVar1 + uVar11 * 8);
    __s2 = in_R8->ptr;
    __n = in_R8->size_;
    do {
      if ((uVar9 != 1) && (*puVar5 == uVar3)) {
        lVar6 = (ulong)(uVar9 - 2) * 0x10;
        if (*(size_t *)(MVar12.ptr.field_1.value + 8 + lVar6) == __n) {
          if (__n != 0) {
            iVar4 = bcmp(*(void **)(lVar6 + MVar12.ptr.field_1.value),__s2,__n);
            if (iVar4 != 0) goto LAB_00149a9a;
          }
          aVar7.value = 0;
          *(undefined1 *)this = 1;
          this->erasedCount = (ulong)(uVar9 - 2);
          goto LAB_00149ad3;
        }
      }
LAB_00149a9a:
      aVar7.value = 0;
      uVar10 = uVar11 + 1;
      uVar11 = uVar10 & 0xffffffff;
      if (uVar10 == uVar2) {
        uVar11 = 0;
      }
      puVar5 = (uint *)(puVar1 + uVar11 * 8);
      uVar9 = puVar5[1];
    } while (uVar9 != 0);
  }
  *(undefined1 *)this = 0;
LAB_00149ad3:
  MVar13.ptr.field_1.value = aVar7.value;
  MVar13.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar13.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }